

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::WeakFulfiller<capnp::Capability::Client>::detach
          (WeakFulfiller<capnp::Capability::Client> *this,
          PromiseFulfiller<capnp::Capability::Client> *from)

{
  if (this->inner != (PromiseFulfiller<capnp::Capability::Client> *)0x0) {
    this->inner = (PromiseFulfiller<capnp::Capability::Client> *)0x0;
    return;
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

void detach(PromiseFulfiller<T>& from) {
    if (inner == nullptr) {
      // Already disposed.
      delete this;
    } else {
      KJ_IREQUIRE(inner == &from);
      inner = nullptr;
    }
  }